

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_tls_policy::get(_tls_policy *this,service *srv)

{
  application *paVar1;
  service *in_RDX;
  
  paVar1 = booster::thread_specific_ptr<cppcms::application>::release
                     ((thread_specific_ptr<cppcms::application> *)(srv + 3));
  if (paVar1 == (application *)0x0) {
    paVar1 = _policy::get_new((_policy *)srv,in_RDX);
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)this,paVar1,true);
  }
  else {
    (this->super__policy)._vptr__policy = (_func_int **)paVar1;
    booster::intrusive_ptr_add_ref(paVar1);
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		application *app = tss_.release();
		if(!app)
			return get_new(srv);
		return app;
	}